

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O2

void pstrcpy(char *buf,int buf_size,char *str)

{
  char cVar1;
  char *pcVar2;
  
  if (0 < buf_size) {
    pcVar2 = buf + ((ulong)(uint)buf_size - 1);
    for (; (cVar1 = *str, cVar1 != '\0' && (buf < pcVar2)); buf = buf + 1) {
      str = str + 1;
      *buf = cVar1;
    }
    *buf = '\0';
  }
  return;
}

Assistant:

void pstrcpy(char *buf, int buf_size, const char *str)
{
    int c;
    char *q = buf;

    if (buf_size <= 0)
        return;

    for(;;) {
        c = *str++;
        if (c == 0 || q >= buf + buf_size - 1)
            break;
        *q++ = c;
    }
    *q = '\0';
}